

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

int __thiscall Fl_Data_Type::open(Fl_Data_Type *this,char *__file,int __oflag,...)

{
  char *__s2;
  Fl_Input *pFVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  Fl_Class_Type *pFVar7;
  Fl_Button *pFVar8;
  char *pcVar9;
  Fl_Menu_Item *pFVar10;
  Fl_Choice **ppFVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  Fl_Choice *pFVar15;
  uint uVar16;
  Fl_Input_ *pFVar17;
  Fl_Choice **ppFVar18;
  byte *pbVar19;
  
  if (data_panel == (Fl_Double_Window *)0x0) {
    make_data_panel();
  }
  Fl_Input_::static_value
            (&data_input->super_Fl_Input_,(this->super_Fl_Decl_Type).super_Fl_Type.name_);
  pFVar7 = Fl_Type::is_in_class((Fl_Type *)this);
  uVar13 = (uint)(this->super_Fl_Decl_Type).public_;
  if (pFVar7 == (Fl_Class_Type *)0x0) {
    ppFVar11 = &data_choice;
    Fl_Choice::value(data_choice,(uVar13 & 1) + ((byte)(this->super_Fl_Decl_Type).static_ & 1) * 2);
    ppFVar18 = &data_class_choice;
  }
  else {
    ppFVar11 = &data_class_choice;
    Fl_Choice::value(data_class_choice,uVar13);
    ppFVar18 = &data_choice;
  }
  (*((*ppFVar11)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
  (*((*ppFVar18)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  pcVar14 = this->filename_;
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "";
  }
  Fl_Input_::value(&data_filename->super_Fl_Input_,pcVar14);
  pcVar14 = (this->super_Fl_Decl_Type).super_Fl_Type.comment_;
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "";
  }
  Fl_Text_Buffer::text((data_comment_input->super_Fl_Text_Display).mBuffer,pcVar14);
  pcVar14 = (char *)data_panel;
  (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  bVar3 = true;
  do {
    uVar13 = 1;
    if (!bVar3) {
      pcVar14 = "%s";
      fl_alert("%s");
    }
    while( true ) {
      pFVar8 = (Fl_Button *)Fl::readqueue();
      if (pFVar8 == data_panel_cancel) goto LAB_0017c389;
      if (pFVar8 == &data_panel_ok->super_Fl_Button) break;
      if (pFVar8 == data_filebrowser) {
        goto_source_dir();
        pcVar14 = "Load Binary Data";
        pcVar9 = fl_file_chooser("Load Binary Data",(char *)0x0,
                                 (data_filename->super_Fl_Input_).value_,1);
        leave_source_dir();
        pFVar1 = data_filename;
        if (pcVar9 != (char *)0x0) {
          iVar6 = strcmp(pcVar9,(data_filename->super_Fl_Input_).value_);
          pcVar14 = (char *)pFVar1;
          if (iVar6 != 0) {
            set_modflag(1);
            pcVar14 = (char *)data_filename;
          }
          Fl_Input_::value((Fl_Input_ *)pcVar14,pcVar9);
        }
      }
      else if (pFVar8 == (Fl_Button *)0x0) {
        Fl::wait(pcVar14);
      }
    }
    pcVar14 = strdup((data_input->super_Fl_Input_).value_);
    pcVar9 = &((Fl_Input_ *)((long)pcVar14 + -200))->field_0xc7;
    pbVar2 = (byte *)((long)&(((Fl_Window *)&((Fl_Input_ *)pcVar14)->super_Fl_Widget)->
                             super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget + 2);
    pFVar17 = (Fl_Input_ *)pcVar14;
    do {
      pbVar19 = pbVar2;
      pFVar17 = (Fl_Input_ *)
                ((long)&(((Fl_Window *)&pFVar17->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget.
                        _vptr_Fl_Widget + 1);
      bVar4 = pcVar9[1];
      uVar16 = (uint)bVar4;
      pcVar9 = pcVar9 + 1;
      iVar6 = isspace(uVar16);
      pbVar2 = pbVar19 + 1;
    } while (iVar6 != 0);
    iVar6 = isalpha((uint)bVar4);
    if (((iVar6 != 0) || (uVar16 == 0x5f)) || (uVar16 == 0x3a)) {
      lVar12 = -1;
      while( true ) {
        bVar4 = *(byte *)&(((Fl_Window *)&pFVar17->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget
                          ._vptr_Fl_Widget;
        iVar6 = isalnum((uint)bVar4);
        if (((iVar6 == 0) && (bVar4 != 0x3a)) && (bVar4 != 0x5f)) break;
        pFVar17 = (Fl_Input_ *)
                  ((long)&(((Fl_Window *)&pFVar17->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget
                          ._vptr_Fl_Widget + 1);
        lVar12 = lVar12 + -1;
        pbVar19 = pbVar19 + 1;
      }
      while (bVar4 != 0) {
        iVar6 = isspace((uint)bVar4);
        if (iVar6 == 0) goto LAB_0017c124;
        lVar12 = lVar12 + -1;
        bVar4 = *pbVar19;
        pbVar19 = pbVar19 + 1;
      }
      if (lVar12 != 0) break;
    }
LAB_0017c124:
    free(pcVar14);
    bVar3 = false;
  } while( true );
  *(undefined1 *)
   &(((Fl_Window *)&pFVar17->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = 0;
  Fl_Type::name((Fl_Type *)this,pcVar9);
  free(pcVar14);
  pFVar7 = Fl_Type::is_in_class((Fl_Type *)this);
  uVar16 = (uint)(this->super_Fl_Decl_Type).public_;
  if (pFVar7 == (Fl_Class_Type *)0x0) {
    pFVar10 = (data_choice->super_Fl_Menu_).value_;
    if (pFVar10 != (Fl_Menu_Item *)0x0) {
      uVar13 = (uint)(((long)pFVar10 - (long)(data_choice->super_Fl_Menu_).menu_) / 0x38) & 1;
    }
    pFVar15 = data_choice;
    if (uVar13 != uVar16) {
      set_modflag(1);
      pFVar15 = data_choice;
      pFVar10 = (data_choice->super_Fl_Menu_).value_;
      if (pFVar10 == (Fl_Menu_Item *)0x0) {
        bVar4 = 1;
      }
      else {
        bVar4 = (byte)(((long)pFVar10 - (long)(data_choice->super_Fl_Menu_).menu_) / 0x38) & 1;
      }
      (this->super_Fl_Decl_Type).public_ = bVar4;
    }
    if (pFVar10 == (Fl_Menu_Item *)0x0) {
      uVar13 = 1;
    }
    else {
      uVar13 = (uint)((ulong)(((long)pFVar10 - (long)(pFVar15->super_Fl_Menu_).menu_) / 0x38) >> 1)
               & 1;
    }
    if (uVar13 != (int)(this->super_Fl_Decl_Type).static_) {
      set_modflag(1);
      pFVar10 = (data_choice->super_Fl_Menu_).value_;
      if (pFVar10 == (Fl_Menu_Item *)0x0) {
        bVar4 = 1;
      }
      else {
        bVar4 = (byte)((ulong)(((long)pFVar10 - (long)(data_choice->super_Fl_Menu_).menu_) / 0x38)
                      >> 1) & 1;
      }
      (this->super_Fl_Decl_Type).static_ = bVar4;
    }
  }
  else {
    pFVar10 = (data_class_choice->super_Fl_Menu_).value_;
    if (pFVar10 == (Fl_Menu_Item *)0x0) {
      uVar13 = 0xffffffff;
    }
    else {
      uVar13 = (uint)(((long)pFVar10 - (long)(data_class_choice->super_Fl_Menu_).menu_) / 0x38);
    }
    if (uVar13 != uVar16) {
      set_modflag(1);
      pFVar10 = (data_class_choice->super_Fl_Menu_).value_;
      if (pFVar10 == (Fl_Menu_Item *)0x0) {
        cVar5 = -1;
      }
      else {
        cVar5 = (char)(((long)pFVar10 - (long)(data_class_choice->super_Fl_Menu_).menu_) / 0x38);
      }
      (this->super_Fl_Decl_Type).public_ = cVar5;
    }
  }
  pcVar14 = (data_filename->super_Fl_Input_).value_;
  pcVar9 = this->filename_;
  if (pcVar9 == (char *)0x0) {
    if (*pcVar14 == '\0') goto LAB_0017c324;
LAB_0017c2da:
    set_modflag(1);
    pcVar9 = this->filename_;
    if (pcVar9 != (char *)0x0) goto LAB_0017c2f2;
  }
  else {
    iVar6 = strcmp(pcVar9,pcVar14);
    if (iVar6 != 0) goto LAB_0017c2da;
LAB_0017c2f2:
    free(pcVar9);
    this->filename_ = (char *)0x0;
  }
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    pcVar14 = strdup(pcVar14);
    this->filename_ = pcVar14;
  }
LAB_0017c324:
  pcVar14 = Fl_Text_Buffer::text((data_comment_input->super_Fl_Text_Display).mBuffer);
  if ((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) {
    if ((this->super_Fl_Decl_Type).super_Fl_Type.comment_ != (char *)0x0) {
      redraw_browser();
    }
    pcVar9 = (char *)0x0;
  }
  else {
    __s2 = (this->super_Fl_Decl_Type).super_Fl_Type.comment_;
    pcVar9 = pcVar14;
    if ((__s2 == (char *)0x0) || (iVar6 = strcmp(pcVar14,__s2), iVar6 != 0)) {
      redraw_browser();
    }
  }
  Fl_Type::comment((Fl_Type *)this,pcVar9);
  free(pcVar14);
LAB_0017c389:
  iVar6 = (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar6;
}

Assistant:

void Fl_Data_Type::open() {
  if (!data_panel) make_data_panel();
  data_input->static_value(name());
  if (is_in_class()) {
    data_class_choice->value(public_);
    data_class_choice->show();
    data_choice->hide();
  } else {
    data_choice->value((public_&1)|((static_&1)<<1));
    data_choice->show();
    data_class_choice->hide();
  }
  data_filename->value(filename_?filename_:"");
  const char *c = comment();
  data_comment_input->buffer()->text(c?c:"");
  data_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == data_panel_cancel) goto BREAK2;
      else if (w == data_panel_ok) break;
      else if (w == data_filebrowser) {
        goto_source_dir();
        const char *fn = fl_file_chooser("Load Binary Data", 0L, data_filename->value(), 1);
        leave_source_dir();
        if (fn) {
          if (strcmp(fn, data_filename->value()))
            set_modflag(1); 
          data_filename->value(fn);
        }
      }
      else if (!w) Fl::wait();
    }
    // store the variable name:
    const char*c = data_input->value();
    char *s = strdup(c), *p = s, *q, *n;
    for (;;++p) {
      if (!isspace((unsigned char)(*p))) break;
    }
    n = p;
    if ( (!isalpha((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) goto OOPS;
    ++p;
    for (;;++p) {
      if ( (!isalnum((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) break;
    }
    q = p;
    for (;;++q) {
      if (!*q) break;
      if (!isspace((unsigned char)(*q))) goto OOPS;
    }		
    if (n==q) {
    OOPS: message = "variable name must be a C identifier";
      free((void*)s);
      continue;
    }
    *p = 0;
    name(n);
    free(s);
    // store flags
    if (is_in_class()) {
      if (public_!=data_class_choice->value()) {
        set_modflag(1);
        public_ = data_class_choice->value();
      }
    } else {
      if (public_!=(data_choice->value()&1)) {
        set_modflag(1);
        public_ = (data_choice->value()&1);
      }
      if (static_!=((data_choice->value()>>1)&1)) {
        set_modflag(1);
        static_ = ((data_choice->value()>>1)&1);
      }
    }
    // store the filename
    c = data_filename->value();
    if (filename_ && strcmp(filename_, data_filename->value()))
      set_modflag(1); 
    else if (!filename_ && *c)
      set_modflag(1);
    if (filename_) { free((void*)filename_); filename_ = 0L; }
    if (c && *c) filename_ = strdup(c);
    // store the comment
    c = data_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    break;
  }
BREAK2:
  data_panel->hide();
}